

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O2

void __thiscall absl::lts_20250127::LogEntry::LogEntry(LogEntry *this)

{
  (this->timestamp_).rep_.rep_hi_.lo_ = 0;
  (this->timestamp_).rep_.rep_hi_.hi_ = 0;
  (this->timestamp_).rep_.rep_lo_ = 0;
  (this->text_message_with_prefix_and_newline_and_nul_).ptr_ = (pointer)0x0;
  (this->text_message_with_prefix_and_newline_and_nul_).len_ = 0;
  (this->encoding_)._M_len = 0;
  (this->encoding_)._M_str = (char *)0x0;
  (this->full_filename_)._M_len = 0;
  (this->full_filename_)._M_str = (char *)0x0;
  (this->base_filename_)._M_len = 0;
  (this->base_filename_)._M_str = (char *)0x0;
  (this->stacktrace_)._M_dataplus._M_p = (pointer)&(this->stacktrace_).field_2;
  (this->stacktrace_)._M_string_length = 0;
  (this->stacktrace_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

constexpr HiRep& operator=(const int64_t value) {
      // "If the destination type is unsigned, the resulting value is the
      // smallest unsigned value equal to the source value modulo 2^n
      // where `n` is the number of bits used to represent the destination
      // type".
      const auto unsigned_value = static_cast<uint64_t>(value);
      hi_ = static_cast<uint32_t>(unsigned_value >> 32);
      lo_ = static_cast<uint32_t>(unsigned_value);
      return *this;
    }